

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::flipinsertfacet
          (tetgenmesh *this,arraypool *crosstets,arraypool *toppoints,arraypool *botpoints,
          arraypool *midpoints)

{
  int iVar1;
  char *pcVar2;
  arraypool *this_00;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  arraypool *this_01;
  point pdVar9;
  point pd_00;
  point pa;
  point pb;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  bool local_301;
  triface *local_2d8;
  triface *local_2b8;
  long totalfcount;
  long f44count;
  long f32count;
  long f23count;
  int i;
  int n;
  int fcount;
  int flipflag;
  int copcount;
  int convcount;
  double ori [3];
  flipconstraints fc;
  point *parypt;
  point pe;
  point pd;
  point p2;
  point p1;
  point plane_pc;
  point plane_pb;
  point plane_pa;
  badface bface;
  badface *popbf;
  badface *pqueue;
  triface *parytet;
  triface neightet;
  triface newface;
  triface fliptet;
  triface baktets [2];
  triface fliptets [6];
  arraypool *bfacearray;
  arraypool *crossfaces;
  arraypool *midpoints_local;
  arraypool *botpoints_local;
  arraypool *toppoints_local;
  arraypool *crosstets_local;
  tetgenmesh *this_local;
  
  local_2b8 = (triface *)&baktets[1].ver;
  do {
    triface::triface(local_2b8);
    local_2b8 = local_2b8 + 1;
  } while (local_2b8 != (triface *)&fliptets[5].ver);
  local_2d8 = (triface *)&fliptet.ver;
  do {
    triface::triface(local_2d8);
    local_2d8 = local_2d8 + 1;
  } while (local_2d8 != (triface *)&baktets[1].ver);
  triface::triface((triface *)&newface.ver);
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&parytet);
  badface::badface((badface *)&plane_pa);
  flipconstraints::flipconstraints((flipconstraints *)(ori + 2));
  lVar10 = this->flip23count;
  lVar11 = this->flip32count;
  lVar12 = this->flip44count;
  calculateabovepoint(this,midpoints,&plane_pb,&plane_pc,&p1);
  for (f23count._0_4_ = 0; (long)(int)(uint)f23count < toppoints->objects;
      f23count._0_4_ = (uint)f23count + 1) {
    pcVar2 = toppoints->toparray
             [(int)(uint)f23count >> ((byte)toppoints->log2objectsperblock & 0x1f)];
    uVar4 = toppoints->objectsperblockmark;
    iVar1 = toppoints->objectbytes;
    bVar3 = pmarktested(this,*(point *)(pcVar2 + (int)(((uint)f23count & uVar4) * iVar1)));
    if (!bVar3) {
      pmarktest2(this,*(point *)(pcVar2 + (int)(((uint)f23count & uVar4) * iVar1)));
    }
  }
  for (f23count._0_4_ = 0; (long)(int)(uint)f23count < botpoints->objects;
      f23count._0_4_ = (uint)f23count + 1) {
    pcVar2 = botpoints->toparray
             [(int)(uint)f23count >> ((byte)botpoints->log2objectsperblock & 0x1f)];
    uVar4 = botpoints->objectsperblockmark;
    iVar1 = botpoints->objectbytes;
    bVar3 = pmarktested(this,*(point *)(pcVar2 + (int)(((uint)f23count & uVar4) * iVar1)));
    if (!bVar3) {
      pmarktest3(this,*(point *)(pcVar2 + (int)(((uint)f23count & uVar4) * iVar1)));
    }
  }
  this_00 = this->cavetetlist;
  for (f23count._0_4_ = 0; (long)(int)(uint)f23count < crosstets->objects;
      f23count._0_4_ = (uint)f23count + 1) {
    pqueue = (badface *)
             (crosstets->toparray
              [(int)(uint)f23count >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
             (int)(((uint)f23count & crosstets->objectsperblockmark) * crosstets->objectbytes));
    triface::operator=((triface *)&newface.ver,(triface *)pqueue);
    for (fliptet.tet._0_4_ = 0; (int)fliptet.tet < 4; fliptet.tet._0_4_ = (int)fliptet.tet + 1) {
      fsym(this,(triface *)&newface.ver,(triface *)&parytet);
      bVar3 = infected(this,(triface *)&parytet);
      if ((bVar3) && (bVar3 = marktested(this,(triface *)&parytet), !bVar3)) {
        arraypool::newindex(this_00,&pqueue);
        triface::operator=(&pqueue->tt,(triface *)&newface.ver);
      }
    }
    marktest(this,(triface *)&newface.ver);
  }
  if (1 < this->b->verbose) {
    printf("    Found %ld crossing faces.\n",this_00->objects);
  }
  for (f23count._0_4_ = 0; (long)(int)(uint)f23count < crosstets->objects;
      f23count._0_4_ = (uint)f23count + 1) {
    pqueue = (badface *)
             (crosstets->toparray
              [(int)(uint)f23count >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
             (int)(((uint)f23count & crosstets->objectsperblockmark) * crosstets->objectbytes));
    unmarktest(this,(triface *)pqueue);
    uninfect(this,&pqueue->tt);
  }
  popbf = (badface *)0x0;
  for (f23count._0_4_ = 0; (long)(int)(uint)f23count < this_00->objects;
      f23count._0_4_ = (uint)f23count + 1) {
    pqueue = (badface *)
             (this_00->toparray[(int)(uint)f23count >> ((byte)this_00->log2objectsperblock & 0x1f)]
             + (int)(((uint)f23count & this_00->objectsperblockmark) * this_00->objectbytes));
    flipcertify(this,(triface *)pqueue,&popbf,plane_pb,plane_pc,p1);
  }
  arraypool::restart(this_00);
  this_01 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_01,0x10,4);
  i = 0;
  do {
    do {
      do {
        if (popbf == (badface *)0x0) {
          if ((0 < this_01->objects) && (i == 0)) {
            printf("!! No flip is found in %ld faces.\n",this_01->objects);
            terminatetetgen(this,2);
          }
          if (this_01 != (arraypool *)0x0) {
            arraypool::~arraypool(this_01);
            operator_delete(this_01,0x30);
          }
          for (f23count._0_4_ = 0; (long)(int)(uint)f23count < toppoints->objects;
              f23count._0_4_ = (uint)f23count + 1) {
            punmarktest2(this,*(point *)(toppoints->toparray
                                         [(int)(uint)f23count >>
                                          ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                        (int)(((uint)f23count & toppoints->objectsperblockmark) *
                                             toppoints->objectbytes)));
          }
          for (f23count._0_4_ = 0; (long)(int)(uint)f23count < botpoints->objects;
              f23count._0_4_ = (uint)f23count + 1) {
            punmarktest3(this,*(point *)(botpoints->toparray
                                         [(int)(uint)f23count >>
                                          ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                        (int)(((uint)f23count & botpoints->objectsperblockmark) *
                                             botpoints->objectbytes)));
          }
          lVar10 = this->flip23count - lVar10;
          lVar11 = this->flip32count - lVar11;
          lVar12 = this->flip44count - lVar12;
          if (2 < this->b->verbose) {
            printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",lVar10 + lVar11 + lVar12
                   ,lVar10,lVar11,lVar12);
          }
          return;
        }
        bface.nextitem = popbf;
        badface::operator=((badface *)&plane_pa,popbf);
        popbf = popbf->nextitem;
        memorypool::dealloc(this->flippool,bface.nextitem);
        bVar3 = isdeadtet(this,(triface *)&plane_pa);
      } while ((((bVar3) ||
                (pdVar9 = org(this,(triface *)&plane_pa), pdVar9 != (point)bface.cent[5])) ||
               (pdVar9 = dest(this,(triface *)&plane_pa), pdVar9 != bface.forg)) ||
              ((pdVar9 = apex(this,(triface *)&plane_pa), pdVar9 != bface.fdest ||
               (pdVar9 = oppo(this,(triface *)&plane_pa), pdVar9 != bface.fapex))));
      triface::operator=((triface *)&newface.ver,(triface *)&plane_pa);
      fsym(this,(triface *)&newface.ver,(triface *)&parytet);
      pdVar9 = oppo(this,(triface *)&parytet);
    } while (pdVar9 != bface.foppo);
    pdVar9 = oppo(this,(triface *)&newface.ver);
    pd_00 = oppo(this,(triface *)&parytet);
    if (2 < this->b->verbose) {
      uVar4 = pointmark(this,(point)bface.cent[5]);
      uVar5 = pointmark(this,bface.forg);
      uVar6 = pointmark(this,bface.fdest);
      uVar7 = pointmark(this,bface.fapex);
      uVar8 = pointmark(this,bface.foppo);
      printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",bface.ss._8_8_,(ulong)uVar4,
             (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
    }
    n = 0;
    flipflag = 3;
    fcount = 0;
    for (f23count._0_4_ = 0; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
      pa = org(this,(triface *)&newface.ver);
      pb = dest(this,(triface *)&newface.ver);
      dVar13 = orient3d(pa,pb,pdVar9,pd_00);
      *(double *)(&copcount + (long)(int)(uint)f23count * 2) = dVar13;
      if (0.0 < *(double *)(&copcount + (long)(int)(uint)f23count * 2) ||
          *(double *)(&copcount + (long)(int)(uint)f23count * 2) == 0.0) {
        if ((*(double *)(&copcount + (long)(int)(uint)f23count * 2) == 0.0) &&
           (!NAN(*(double *)(&copcount + (long)(int)(uint)f23count * 2)))) {
          flipflag = flipflag + -1;
          fcount = fcount + 1;
        }
      }
      else {
        flipflag = flipflag + -1;
      }
      enextself(this,(triface *)&newface.ver);
    }
    if (flipflag == 3) {
      triface::operator=((triface *)&baktets[1].ver,(triface *)&newface.ver);
      triface::operator=((triface *)&fliptets[0].ver,(triface *)&parytet);
      flip23(this,(triface *)&baktets[1].ver,1,(flipconstraints *)(ori + 2));
      for (f23count._0_4_ = 0; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
        eprevesym(this,(triface *)&baktets[(long)(int)(uint)f23count + 1].ver,
                  (triface *)&neightet.ver);
        arraypool::newindex(this_00,&pqueue);
        triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
      }
      for (f23count._0_4_ = 0; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
        enextesym(this,(triface *)&baktets[(long)(int)(uint)f23count + 1].ver,
                  (triface *)&neightet.ver);
        arraypool::newindex(this_00,&pqueue);
        triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
      }
      n = 1;
    }
    else if (flipflag == 2) {
      f23count._0_4_ = 0;
      while (((int)(uint)f23count < 3 &&
             (0.0 < *(double *)(&copcount + (long)(int)(uint)f23count * 2)))) {
        enextself(this,(triface *)&newface.ver);
        f23count._0_4_ = (uint)f23count + 1;
      }
      esym(this,(triface *)&newface.ver,(triface *)&baktets[1].ver);
      f23count._4_4_ = 0;
      do {
        pdVar9 = apex(this,(triface *)&baktets[(long)f23count._4_4_ + 1].ver);
        bVar3 = pmarktested(this,pdVar9);
        if (((!bVar3) && (bVar3 = pmarktest2ed(this,pdVar9), !bVar3)) &&
           (bVar3 = pmarktest3ed(this,pdVar9), !bVar3)) {
          f23count._4_4_ = 1000;
          break;
        }
        fnext(this,(triface *)&baktets[(long)f23count._4_4_ + 1].ver,
              (triface *)&baktets[(long)(f23count._4_4_ + 1) + 1].ver);
        f23count._4_4_ = f23count._4_4_ + 1;
        local_301 = *(long *)&baktets[(long)f23count._4_4_ + 1].ver != newface._8_8_ &&
                    f23count._4_4_ < 5;
      } while (local_301);
      if (f23count._4_4_ == 3) {
        flip32(this,(triface *)&baktets[1].ver,1,(flipconstraints *)(ori + 2));
        for (f23count._0_4_ = 0; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          esym(this,(triface *)&baktets[1].ver,(triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
          enextself(this,(triface *)&baktets[1].ver);
        }
        for (f23count._0_4_ = 0; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          esym(this,(triface *)&fliptets[0].ver,(triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
          enextself(this,(triface *)&fliptets[0].ver);
        }
        n = 1;
      }
      else if ((f23count._4_4_ == 4) && (fcount == 1)) {
        triface::operator=((triface *)&baktets[1].ver,(triface *)&newface.ver);
        triface::operator=((triface *)&fliptet.ver,(triface *)&fliptets[1].ver);
        triface::operator=((triface *)&baktets[0].ver,(triface *)&fliptets[2].ver);
        flip23(this,(triface *)&baktets[1].ver,1,(flipconstraints *)(ori + 2));
        for (f23count._0_4_ = 1; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          eprevesym(this,(triface *)&baktets[(long)(int)(uint)f23count + 1].ver,
                    (triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
        }
        for (f23count._0_4_ = 1; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          enextesym(this,(triface *)&baktets[(long)(int)(uint)f23count + 1].ver,
                    (triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
        }
        enextesymself(this,(triface *)&baktets[1].ver);
        eprevself(this,(triface *)&baktets[1].ver);
        triface::operator=((triface *)&fliptets[0].ver,(triface *)&fliptet.ver);
        triface::operator=((triface *)&fliptets[1].ver,(triface *)&baktets[0].ver);
        flip32(this,(triface *)&baktets[1].ver,1,(flipconstraints *)(ori + 2));
        enextself(this,(triface *)&baktets[1].ver);
        for (f23count._0_4_ = 1; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          esym(this,(triface *)&baktets[1].ver,(triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
          enextself(this,(triface *)&baktets[1].ver);
        }
        enextself(this,(triface *)&fliptets[0].ver);
        for (f23count._0_4_ = 1; (int)(uint)f23count < 3; f23count._0_4_ = (uint)f23count + 1) {
          esym(this,(triface *)&fliptets[0].ver,(triface *)&neightet.ver);
          arraypool::newindex(this_00,&pqueue);
          triface::operator=(&pqueue->tt,(triface *)&neightet.ver);
          enextself(this,(triface *)&fliptets[0].ver);
        }
        this->flip23count = this->flip23count + -1;
        this->flip32count = this->flip32count + -1;
        this->flip44count = this->flip44count + 1;
        n = 1;
      }
    }
    else {
      n = -1;
      if (2 < this->b->verbose) {
        uVar4 = pointmark(this,(point)bface.cent[5]);
        uVar5 = pointmark(this,bface.forg);
        uVar6 = pointmark(this,bface.fdest);
        uVar7 = pointmark(this,bface.fapex);
        uVar8 = pointmark(this,bface.foppo);
        printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",bface.ss._8_8_,
               (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
      }
    }
    if (n == 1) {
      for (f23count._0_4_ = 0; (long)(int)(uint)f23count < this_00->objects;
          f23count._0_4_ = (uint)f23count + 1) {
        pqueue = (badface *)
                 (this_00->toparray
                  [(int)(uint)f23count >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                 (int)(((uint)f23count & this_00->objectsperblockmark) * this_00->objectbytes));
        flipcertify(this,(triface *)pqueue,&popbf,plane_pb,plane_pc,p1);
      }
      arraypool::restart(this_00);
      for (f23count._0_4_ = 0; (long)(int)(uint)f23count < this_01->objects;
          f23count._0_4_ = (uint)f23count + 1) {
        pqueue = (badface *)
                 (this_01->toparray
                  [(int)(uint)f23count >> ((byte)this_01->log2objectsperblock & 0x1f)] +
                 (int)(((uint)f23count & this_01->objectsperblockmark) * this_01->objectbytes));
        bVar3 = isdeadtet(this,(triface *)pqueue);
        if (!bVar3) {
          flipcertify(this,&pqueue->tt,&popbf,plane_pb,plane_pc,p1);
        }
      }
      arraypool::restart(this_01);
      i = i + 1;
    }
    else if (n == 0) {
      arraypool::newindex(this_01,&pqueue);
      triface::operator=(&pqueue->tt,(triface *)&newface.ver);
    }
  } while( true );
}

Assistant:

void tetgenmesh::flipinsertfacet(arraypool *crosstets, arraypool *toppoints,
                                 arraypool *botpoints, arraypool *midpoints)
{
  arraypool *crossfaces, *bfacearray;
  triface fliptets[6], baktets[2], fliptet, newface;
  triface neightet, *parytet;
  badface *pqueue;
  badface *popbf, bface;
  point plane_pa, plane_pb, plane_pc;
  point p1, p2, pd, pe;
  point *parypt;
  flipconstraints fc;
  REAL ori[3];
  int convcount, copcount;
  int flipflag, fcount;
  int n, i;
  long f23count, f32count, f44count;
  long totalfcount;

  f23count = flip23count;
  f32count = flip32count;
  f44count = flip44count;

  // Get three affinely independent vertices in the missing region R.
  calculateabovepoint(midpoints, &plane_pa, &plane_pb, &plane_pc);

  // Mark top and bottom points. Do not mark midpoints.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest2(*parypt);
    }
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest3(*parypt);
    }
  }

  // Collect crossing faces. 
  crossfaces = cavetetlist;  // Re-use array 'cavetetlist'.

  // Each crossing face contains at least one bottom vertex and
  //   one top vertex.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    fliptet = *parytet;
    for (fliptet.ver = 0; fliptet.ver < 4; fliptet.ver++) {
      fsym(fliptet, neightet);
      if (infected(neightet)) { // It is an interior face.
        if (!marktested(neightet)) { // It is an unprocessed face.
          crossfaces->newindex((void **) &parytet);
          *parytet = fliptet;
        }
      }
    }
    marktest(fliptet);
  }

  if (b->verbose > 1) {
    printf("    Found %ld crossing faces.\n", crossfaces->objects);
  }

  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    unmarktest(*parytet);
    uninfect(*parytet);
  }

  // Initialize the priority queue.
  pqueue = NULL;

  for (i = 0; i < crossfaces->objects; i++) {
    parytet = (triface *) fastlookup(crossfaces, i);
    flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
  }
  crossfaces->restart();

  // The list for temporarily storing unflipable faces.
  bfacearray = new arraypool(sizeof(triface), 4);


  fcount = 0;  // Count the number of flips.

  // Flip insert the facet.
  while (pqueue != NULL) {

    // Pop a face from the priority queue.
    popbf = pqueue;
    bface = *popbf;
    // Update the queue.
    pqueue = pqueue->nextitem;
    // Delete the popped item from the pool.
    flippool->dealloc((void *) popbf);

    if (!isdeadtet(bface.tt)) {
      if ((org(bface.tt) == bface.forg) && (dest(bface.tt) == bface.fdest) &&
          (apex(bface.tt) == bface.fapex) && (oppo(bface.tt) == bface.foppo)) {
        // It is still a crossing face of R.
        fliptet = bface.tt;
        fsym(fliptet, neightet);
        if (oppo(neightet) == bface.noppo) {
          pd = oppo(fliptet);
          pe = oppo(neightet);

          if (b->verbose > 2) {
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                   pointmark(bface.forg), pointmark(bface.fdest),
                   pointmark(bface.fapex), pointmark(bface.foppo),
                   pointmark(bface.noppo), bface.key);
          }
          flipflag = 0;

          // Check for which type of flip can we do.
          convcount = 3;
          copcount = 0;
          for (i = 0; i < 3; i++) {
            p1 = org(fliptet);
            p2 = dest(fliptet);
            ori[i] = orient3d(p1, p2, pd, pe);
            if (ori[i] < 0) {
              convcount--;
              //break;
            } else if (ori[i] == 0) {
              convcount--; // Possible 4-to-4 flip.
              copcount++;
              //break;
            }
            enextself(fliptet);
          }

          if (convcount == 3) {
            // A 2-to-3 flip is found.
            fliptets[0] = fliptet; // abcd, d may be the new vertex.
            fliptets[1] = neightet; // bace.
            flip23(fliptets, 1, &fc);
            // Put the link faces into check list.
            for (i = 0; i < 3; i++) {
              eprevesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            for (i = 0; i < 3; i++) {
              enextesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            flipflag = 1;
          } else if (convcount == 2) {
            //if (copcount <= 1) {
            // A 3-to-2 or 4-to-4 may be possible.
            // Get the edge which is locally non-convex or flat. 
            for (i = 0; i < 3; i++) {
              if (ori[i] <= 0) break;
              enextself(fliptet);
            }

            // Collect tets sharing at this edge.
            esym(fliptet, fliptets[0]); // [b,a,d,c]
            n = 0;
            do {
              p1 = apex(fliptets[n]);
              if (!(pmarktested(p1) || pmarktest2ed(p1) || pmarktest3ed(p1))) {
                // This apex is not on the cavity. Hence the face does not
                //   lie inside the cavity. Do not flip this edge.
                n = 1000; break;
              }
              fnext(fliptets[n], fliptets[n + 1]);
              n++;
            } while ((fliptets[n].tet != fliptet.tet) && (n < 5));

            if (n == 3) {
              // Found a 3-to-2 flip.
              flip32(fliptets, 1, &fc);
              // Put the link faces into check list.
              for (i = 0; i < 3; i++) {
                esym(fliptets[0], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[0]);
              }
              for (i = 0; i < 3; i++) {
                esym(fliptets[1], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[1]);
              }
              flipflag = 1;
            } else if (n == 4) {
              if (copcount == 1) {                
                // Found a 4-to-4 flip. 
                // Let the six vertices are: a,b,c,d,e,f, where
                //   fliptets[0] = [b,a,d,c]
                //           [1] = [b,a,c,e]
                //           [2] = [b,a,e,f]
                //           [3] = [b,a,f,d]
                // After the 4-to-4 flip, edge [a,b] is flipped, edge [e,d]
                //   is created.
                // First do a 2-to-3 flip.
                // Comment: This flip temporarily creates a degenerated
                //   tet (whose volume is zero). It will be removed by the 
                //   followed 3-to-2 flip.
                fliptets[0] = fliptet; // = [a,b,c,d], d is the new vertex.
                // fliptets[1];        // = [b,a,c,e].
                baktets[0] = fliptets[2]; // = [b,a,e,f]
                baktets[1] = fliptets[3]; // = [b,a,f,d]
                // The flip may involve hull tets.
                flip23(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [e,d,a,b] => will be flipped, so 
                //   [a,b,d] and [a,b,e] are not "outer" link faces.
                for (i = 1; i < 3; i++) {
                  eprevesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                for (i = 1; i < 3; i++) {
                  enextesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                // Then do a 3-to-2 flip.
                enextesymself(fliptets[0]);  // fliptets[0] is [e,d,a,b].
                eprevself(fliptets[0]); // = [b,a,d,c], d is the new vertex.
                fliptets[1] = baktets[0]; // = [b,a,e,f]
                fliptets[2] = baktets[1]; // = [b,a,f,d]
                flip32(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [d,e,f,a]
                //   fliptets[1] = [e,d,f,b]
                //   Faces [a,b,d] and [a,b,e] are not "outer" link faces.
                enextself(fliptets[0]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[0], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[0]);
                }
                enextself(fliptets[1]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[1], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[1]);
                }
                flip23count--;
                flip32count--;
                flip44count++;
                flipflag = 1;
              }
            }
          } else {
            // There are more than 1 non-convex or coplanar cases.
            flipflag = -1; // Ignore this face.
            if (b->verbose > 2) {
              printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                     pointmark(bface.forg), pointmark(bface.fdest),
                     pointmark(bface.fapex), pointmark(bface.foppo),
                     pointmark(bface.noppo), bface.key);
            }
          } // if (convcount == 1)

          if (flipflag == 1) {
            // Update the priority queue.
            for (i = 0; i < crossfaces->objects; i++) {
              parytet = (triface *) fastlookup(crossfaces, i);
              flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
            }
            crossfaces->restart();
            if (1) { // if (!b->flipinsert_random) {
              // Insert all queued unflipped faces.
              for (i = 0; i < bfacearray->objects; i++) {
                parytet = (triface *) fastlookup(bfacearray, i);
                // This face may be changed.
                if (!isdeadtet(*parytet)) {
                  flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
                }
              }
              bfacearray->restart();
            }
            fcount++;
          } else if (flipflag == 0) {
            // Queue an unflippable face. To process it later.
            bfacearray->newindex((void **) &parytet);
            *parytet = fliptet;
          }
        } // if (pe == bface.noppo)  
      } // if ((pa == bface.forg) && ...)
    } // if (bface.tt != NULL)

  } // while (pqueue != NULL)

  if (bfacearray->objects > 0) {
    if (fcount == 0) {
      printf("!! No flip is found in %ld faces.\n", bfacearray->objects);
      terminatetetgen(this, 2); //assert(0);
    }
  }

  delete bfacearray;

  // Un-mark top and bottom points.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    punmarktest2(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    punmarktest3(*parypt);
  }

  f23count = flip23count - f23count;
  f32count = flip32count - f32count;
  f44count = flip44count - f44count;
  totalfcount = f23count + f32count + f44count;
  if (b->verbose > 2) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           totalfcount, f23count, f32count, f44count);
  }
}